

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

void __thiscall re2::Prog::Flatten(Prog *this)

{
  uint uVar1;
  int iVar2;
  unsigned_short *puVar3;
  IndexValue *pIVar4;
  int i;
  int iVar5;
  long lVar6;
  ulong uVar7;
  _Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false> _Var8;
  int iVar9;
  ulong uVar10;
  Prog *this_00;
  ulong uVar11;
  IndexValue *pIVar12;
  vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> flat;
  vector<int,_std::allocator<int>_> flatmap;
  vector<int,_std::allocator<int>_> stk;
  __uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter> local_f8;
  SparseArray<int> rootmap;
  SparseArray<int> sorted;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  predvec;
  SparseSet reachable;
  SparseArray<int> predmap;
  
  if (this->did_flatten_ != false) {
    return;
  }
  this->did_flatten_ = true;
  SparseSetT<void>::SparseSetT(&reachable,this->size_);
  stk.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  stk.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  stk.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve(&stk,(long)this->size_);
  SparseArray<int>::SparseArray(&rootmap,this->size_);
  SparseArray<int>::SparseArray(&predmap,this->size_);
  predvec.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  predvec.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  predvec.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MarkSuccessors(this,&rootmap,&predmap,&predvec,&reachable,&stk);
  SparseArray<int>::SparseArray(&sorted,&rootmap);
  std::
  __sort<re2::SparseArray<int>::IndexValue*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(re2::SparseArray<int>::IndexValue_const&,re2::SparseArray<int>::IndexValue_const&)>>
            (sorted.dense_.ptr_._M_t.
             super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
             ._M_t.
             super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
             .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl,
             sorted.dense_.ptr_._M_t.
             super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
             ._M_t.
             super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
             .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl +
             sorted.size_,
             (_Iter_comp_iter<bool_(*)(const_re2::SparseArray<int>::IndexValue_&,_const_re2::SparseArray<int>::IndexValue_&)>
              )0x1b66c8);
  pIVar12 = sorted.dense_.ptr_._M_t.
            super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
            ._M_t.
            super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
            .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl +
            sorted.size_;
  do {
    pIVar4 = pIVar12 + -1;
    do {
      pIVar12 = pIVar4;
      if (pIVar12 ==
          sorted.dense_.ptr_._M_t.
          super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
          ._M_t.
          super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
          .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl) {
        std::vector<int,_std::allocator<int>_>::vector
                  (&flatmap,(long)rootmap.size_,(allocator_type *)&flat);
        flat.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        flat.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        flat.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::reserve
                  (&flat,(long)this->size_);
        for (_Var8 = rootmap.dense_.ptr_._M_t.
                     super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                     ._M_t.
                     super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                     .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>;
            _Var8._M_head_impl !=
            rootmap.dense_.ptr_._M_t.
            super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
            ._M_t.
            super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
            .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl +
            rootmap.size_; _Var8._M_head_impl = _Var8._M_head_impl + 1) {
          flatmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[(_Var8._M_head_impl)->value_] =
               (int)((ulong)((long)flat.
                                   super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)flat.
                                  super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
          this_00 = this;
          EmitList(this,(_Var8._M_head_impl)->index_,&rootmap,&flat,&reachable,&stk);
          flat.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].out_opcode_ =
               flat.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].out_opcode_ | 8;
          ComputeHints(this_00,&flat,
                       flatmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(_Var8._M_head_impl)->value_],
                       (int)((ulong)((long)flat.
                                           super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)flat.
                                          super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 3));
        }
        this->list_count_ =
             (int)((ulong)((long)flatmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)flatmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2);
        for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
          this->inst_count_[lVar6] = 0;
        }
        uVar10 = (ulong)((long)flat.
                               super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)flat.
                              super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3;
        uVar7 = 0;
        iVar9 = (int)uVar10;
        uVar11 = 0;
        if (0 < iVar9) {
          uVar11 = uVar10 & 0xffffffff;
        }
        for (; uVar11 != uVar7; uVar7 = uVar7 + 1) {
          uVar1 = flat.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar7].out_opcode_;
          uVar10 = 1;
          if ((uVar1 & 7) != 1) {
            flat.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7].out_opcode_ =
                 uVar1 & 0xf |
                 flatmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar1 >> 4] << 4;
            uVar10 = (ulong)(uVar1 & 7);
          }
          this->inst_count_[uVar10] = this->inst_count_[uVar10] + 1;
        }
        iVar2 = this->start_unanchored_;
        if (iVar2 != 0) {
          iVar5 = flatmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[1];
          this->start_unanchored_ = iVar5;
          if (iVar2 != this->start_) {
            iVar5 = flatmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[2];
          }
          this->start_ = iVar5;
        }
        this->size_ = iVar9;
        PODArray<re2::Prog::Inst>::PODArray((PODArray<re2::Prog::Inst> *)&local_f8,iVar9);
        std::__uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>::operator=
                  ((__uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter> *)
                   &this->inst_,&local_f8);
        std::unique_ptr<re2::Prog::Inst[],_re2::PODArray<re2::Prog::Inst>::Deleter>::~unique_ptr
                  ((unique_ptr<re2::Prog::Inst[],_re2::PODArray<re2::Prog::Inst>::Deleter> *)
                   &local_f8);
        memmove((this->inst_).ptr_._M_t.
                super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t
                .super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl,
                flat.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>._M_impl.
                super__Vector_impl_data._M_start,(long)this->size_ << 3);
        if (this->size_ < 0x201) {
          PODArray<unsigned_short>::PODArray((PODArray<unsigned_short> *)&local_f8,this->size_);
          std::__uniq_ptr_impl<unsigned_short,_re2::PODArray<unsigned_short>::Deleter>::operator=
                    ((__uniq_ptr_impl<unsigned_short,_re2::PODArray<unsigned_short>::Deleter> *)
                     &this->list_heads_,
                     (__uniq_ptr_impl<unsigned_short,_re2::PODArray<unsigned_short>::Deleter> *)
                     &local_f8);
          std::unique_ptr<unsigned_short[],_re2::PODArray<unsigned_short>::Deleter>::~unique_ptr
                    ((unique_ptr<unsigned_short[],_re2::PODArray<unsigned_short>::Deleter> *)
                     &local_f8);
          memset((this->list_heads_).ptr_._M_t.
                 super___uniq_ptr_impl<unsigned_short,_re2::PODArray<unsigned_short>::Deleter>._M_t.
                 super__Tuple_impl<0UL,_unsigned_short_*,_re2::PODArray<unsigned_short>::Deleter>.
                 super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl,0xff,
                 (long)this->size_ * 2);
          puVar3 = (this->list_heads_).ptr_._M_t.
                   super___uniq_ptr_impl<unsigned_short,_re2::PODArray<unsigned_short>::Deleter>.
                   _M_t.
                   super__Tuple_impl<0UL,_unsigned_short_*,_re2::PODArray<unsigned_short>::Deleter>.
                   super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
          uVar10 = 0;
          uVar7 = (ulong)(uint)this->list_count_;
          if (this->list_count_ < 1) {
            uVar7 = uVar10;
          }
          for (; uVar7 != uVar10; uVar10 = uVar10 + 1) {
            puVar3[flatmap.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar10]] = (unsigned_short)uVar10;
          }
        }
        std::_Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::~_Vector_base
                  (&flat.super__Vector_base<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&flatmap.super__Vector_base<int,_std::allocator<int>_>);
        SparseArray<int>::~SparseArray(&sorted);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector(&predvec);
        SparseArray<int>::~SparseArray(&predmap);
        SparseArray<int>::~SparseArray(&rootmap);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&stk.super__Vector_base<int,_std::allocator<int>_>);
        SparseSetT<void>::~SparseSetT(&reachable);
        return;
      }
      iVar9 = pIVar12->index_;
      pIVar4 = pIVar12 + -1;
    } while ((iVar9 == this->start_unanchored_) || (iVar9 == this->start_));
    MarkDominator(this,iVar9,&rootmap,&predmap,&predvec,&reachable,&stk);
  } while( true );
}

Assistant:

void Prog::Flatten() {
  if (did_flatten_)
    return;
  did_flatten_ = true;

  // Scratch structures. It's important that these are reused by functions
  // that we call in loops because they would thrash the heap otherwise.
  SparseSet reachable(size());
  std::vector<int> stk;
  stk.reserve(size());

  // First pass: Marks "successor roots" and predecessors.
  // Builds the mapping from inst-ids to root-ids.
  SparseArray<int> rootmap(size());
  SparseArray<int> predmap(size());
  std::vector<std::vector<int>> predvec;
  MarkSuccessors(&rootmap, &predmap, &predvec, &reachable, &stk);

  // Second pass: Marks "dominator roots".
  SparseArray<int> sorted(rootmap);
  std::sort(sorted.begin(), sorted.end(), sorted.less);
  for (SparseArray<int>::const_iterator i = sorted.end() - 1;
       i != sorted.begin();
       --i) {
    if (i->index() != start_unanchored() && i->index() != start())
      MarkDominator(i->index(), &rootmap, &predmap, &predvec, &reachable, &stk);
  }

  // Third pass: Emits "lists". Remaps outs to root-ids.
  // Builds the mapping from root-ids to flat-ids.
  std::vector<int> flatmap(rootmap.size());
  std::vector<Inst> flat;
  flat.reserve(size());
  for (SparseArray<int>::const_iterator i = rootmap.begin();
       i != rootmap.end();
       ++i) {
    flatmap[i->value()] = static_cast<int>(flat.size());
    EmitList(i->index(), &rootmap, &flat, &reachable, &stk);
    flat.back().set_last();
    // We have the bounds of the "list", so this is the
    // most convenient point at which to compute hints.
    ComputeHints(&flat, flatmap[i->value()], static_cast<int>(flat.size()));
  }

  list_count_ = static_cast<int>(flatmap.size());
  for (int i = 0; i < kNumInst; i++)
    inst_count_[i] = 0;

  // Fourth pass: Remaps outs to flat-ids.
  // Counts instructions by opcode.
  for (int id = 0; id < static_cast<int>(flat.size()); id++) {
    Inst* ip = &flat[id];
    if (ip->opcode() != kInstAltMatch)  // handled in EmitList()
      ip->set_out(flatmap[ip->out()]);
    inst_count_[ip->opcode()]++;
  }

  int total = 0;
  for (int i = 0; i < kNumInst; i++)
    total += inst_count_[i];
  DCHECK_EQ(total, static_cast<int>(flat.size()));

  // Remap start_unanchored and start.
  if (start_unanchored() == 0) {
    DCHECK_EQ(start(), 0);
  } else if (start_unanchored() == start()) {
    set_start_unanchored(flatmap[1]);
    set_start(flatmap[1]);
  } else {
    set_start_unanchored(flatmap[1]);
    set_start(flatmap[2]);
  }

  // Finally, replace the old instructions with the new instructions.
  size_ = static_cast<int>(flat.size());
  inst_ = PODArray<Inst>(size_);
  memmove(inst_.data(), flat.data(), size_*sizeof inst_[0]);

  // Populate the list heads for BitState.
  // 512 instructions limits the memory footprint to 1KiB.
  if (size_ <= 512) {
    list_heads_ = PODArray<uint16_t>(size_);
    // 0xFF makes it more obvious if we try to look up a non-head.
    memset(list_heads_.data(), 0xFF, size_*sizeof list_heads_[0]);
    for (int i = 0; i < list_count_; ++i)
      list_heads_[flatmap[i]] = i;
  }
}